

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

pcut_item_t * pcut_find_parent_suite(pcut_item_t *it)

{
  pcut_item_t *local_18;
  pcut_item_t *it_local;
  
  local_18 = it;
  while( true ) {
    if (local_18 == (pcut_item_t *)0x0) {
      init_default_suite_when_needed();
      return &default_suite;
    }
    if (local_18->kind == 4) break;
    local_18 = local_18->previous;
  }
  return local_18;
}

Assistant:

static pcut_item_t *pcut_find_parent_suite(pcut_item_t *it) {
	while (it != NULL) {
		if (it->kind == PCUT_KIND_TESTSUITE) {
			return it;
		}
		it = it->previous;
	}
	init_default_suite_when_needed();
	return &default_suite;
}